

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_bst.h
# Opt level: O0

node ** __thiscall
CP::map_bst<int,_int,_std::less<int>_>::child_link
          (map_bst<int,_int,_std::less<int>_> *this,node *parent,int *k)

{
  bool bVar1;
  map_bst<int,_int,_std::less<int>_> *local_38;
  int *k_local;
  node *parent_local;
  map_bst<int,_int,_std::less<int>_> *this_local;
  
  this_local = this;
  if (parent != (node *)0x0) {
    bVar1 = std::less<int>::operator()((less<int> *)&this->field_0x8,k,(int *)parent);
    if (bVar1) {
      local_38 = (map_bst<int,_int,_std::less<int>_> *)&parent->left;
    }
    else {
      local_38 = (map_bst<int,_int,_std::less<int>_> *)&parent->right;
    }
    this_local = local_38;
  }
  return &this_local->mRoot;
}

Assistant:

node* &child_link(node* parent, const KeyT& k) {
        if (parent == NULL) return mRoot;
        return mLess(k, parent->data.first) ?
               parent->left : parent->right;
    }